

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       format_decimal<char,unsigned_int,char*,fmt::v5::internal::add_thousands_sep<char>>
                 (char *out,uint value,int num_digits,add_thousands_sep<char> sep)

{
  add_thousands_sep<char> thousands_sep;
  type pcVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  char *in_stack_00000008;
  char *in_stack_00000010;
  char *end;
  char_type buffer [13];
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  thousands_sep.digit_index_ = in_EDX;
  thousands_sep.sep_ = (basic_string_view<char>)in_stack_ffffffffffffffe0;
  thousands_sep._20_4_ = in_ESI;
  format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
            (in_stack_00000010,(uint)((ulong)in_stack_00000008 >> 0x20),(int)in_stack_00000008,
             thousands_sep);
  pcVar1 = copy_str<char,char*,char*>(in_stack_00000010,in_stack_00000008,(char *)0x1f72b9);
  return pcVar1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}